

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfo.cpp
# Opt level: O1

InfoStatus
getLocalInfoType(HighsLogOptions *report_log_options,string *name,
                vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *info_records,
                HighsInfoType *type)

{
  InfoStatus IVar1;
  undefined8 in_RAX;
  HighsInt index;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  IVar1 = getInfoIndex(report_log_options,name,info_records,&local_14);
  if (IVar1 == kOk) {
    *type = (info_records->super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>)._M_impl.
            super__Vector_impl_data._M_start[local_14]->type;
    IVar1 = kOk;
  }
  return IVar1;
}

Assistant:

InfoStatus getLocalInfoType(const HighsLogOptions& report_log_options,
                            const std::string& name,
                            const std::vector<InfoRecord*>& info_records,
                            HighsInfoType& type) {
  HighsInt index;
  InfoStatus status =
      getInfoIndex(report_log_options, name, info_records, index);
  if (status != InfoStatus::kOk) return status;
  type = info_records[index]->type;
  return InfoStatus::kOk;
}